

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListTest_splice_range_Test::TestBody(IntrusiveListTest_splice_range_Test *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_03;
  vector<int,_std::allocator<int>_> *expected_04;
  TestObjectList list4;
  TestObjectList list3;
  TestObjectList list1;
  TestObjectList list2;
  int iVar4;
  TestObjectList local_f8;
  TestObjectList local_d8;
  TestObjectList *local_b8;
  undefined8 uStack_b0;
  TestObjectList *local_a8;
  undefined8 uStack_a0;
  TestObjectList *local_98;
  TestObject *pTStack_90;
  TestObjectList local_88;
  TestObjectList local_68;
  TestObjectList local_48;
  
  local_48.size_ = 0;
  local_48.first_ = (TestObject *)0x0;
  local_48.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  local_48.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_200000001;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 3;
  local_48.first_ = pTVar2;
  local_48.size_ = (size_t)local_48.last_;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::NewList
            (&local_88,(IntrusiveListTest *)&local_48,data_values);
  operator_delete(pTVar2);
  local_d8.size_ = 0;
  local_d8.first_ = (TestObject *)0x0;
  local_d8.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  local_d8.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 300
  ;
  local_d8.first_ = pTVar2;
  local_d8.size_ = (size_t)local_d8.last_;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::NewList
            (&local_48,(IntrusiveListTest *)&local_d8,data_values_00);
  operator_delete(pTVar2);
  pTStack_90 = local_48.last_;
  iVar4 = (int)&local_48;
  local_98 = &local_48;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_88,(int)&local_88,(__off64_t *)local_88.first_,iVar4,(__off64_t *)&local_48,
             (size_t)local_48.first_,iVar4);
  local_d8.size_ = 0;
  local_d8.first_ = (TestObject *)0x0;
  local_d8.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0x14);
  local_d8.last_ = (TestObject *)&pTVar2->data2;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)&DAT_200000001;
  pTVar2->data = 3;
  local_d8.first_ = pTVar2;
  local_d8.size_ = (size_t)local_d8.last_;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_88,&local_d8,expected);
  operator_delete(pTVar2);
  local_d8.size_ = 0;
  local_d8.first_ = (TestObject *)0x0;
  local_d8.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(4);
  local_d8.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ + 4);
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = 300
  ;
  local_d8.first_ = pTVar2;
  local_d8.size_ = (size_t)local_d8.last_;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_48,&local_d8,expected_00);
  operator_delete(pTVar2);
  local_f8.size_ = 0;
  local_f8.first_ = (TestObject *)0x0;
  local_f8.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  local_f8.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_258000001f4;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 700
  ;
  local_f8.first_ = pTVar2;
  local_f8.size_ = (size_t)local_f8.last_;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::NewList
            (&local_d8,(IntrusiveListTest *)&local_f8,data_values_01);
  operator_delete(pTVar2);
  if (local_d8.first_ != (TestObject *)0x0) {
    uStack_a0 = 0;
    iVar4 = (int)&local_d8;
    local_a8 = &local_d8;
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
              (&local_88,(int)&local_88,(__off64_t *)0x0,iVar4,(__off64_t *)&local_d8,
               (size_t)((local_d8.first_)->
                       super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_,iVar4);
    local_f8.size_ = 0;
    local_f8.first_ = (TestObject *)0x0;
    local_f8.last_ = (TestObject *)0x0;
    pTVar2 = (TestObject *)operator_new(0x1c);
    local_f8.last_ = (TestObject *)&pTVar2->field_0x1c;
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
         (TestObject *)0xc800000064;
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
         (TestObject *)&DAT_200000001;
    *(undefined8 *)
     ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4) =
         0x300000002;
    pTVar2->data2 = 600;
    pTVar2->moved = true;
    *(undefined3 *)&pTVar2->field_0x19 = 2;
    local_f8.first_ = pTVar2;
    local_f8.size_ = (size_t)local_f8.last_;
    anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq
              ((IntrusiveListTest *)&local_88,&local_f8,expected_01);
    operator_delete(pTVar2);
    local_f8.size_ = 0;
    local_f8.first_ = (TestObject *)0x0;
    local_f8.last_ = (TestObject *)0x0;
    pTVar2 = (TestObject *)operator_new(4);
    local_f8.last_ =
         (TestObject *)
         ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ + 4);
    *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
         500;
    local_f8.first_ = pTVar2;
    local_f8.size_ = (size_t)local_f8.last_;
    anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq
              ((IntrusiveListTest *)&local_d8,&local_f8,expected_02);
    operator_delete(pTVar2);
    local_68.size_ = 0;
    local_68.first_ = (TestObject *)0x0;
    local_68.last_ = (TestObject *)0x0;
    pTVar2 = (TestObject *)operator_new(4);
    local_68.last_ =
         (TestObject *)
         ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ + 4);
    *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
         400;
    local_68.first_ = pTVar2;
    local_68.size_ = (size_t)local_68.last_;
    anon_unknown.dwarf_7b76a::IntrusiveListTest::NewList
              (&local_f8,(IntrusiveListTest *)&local_68,data_values_02);
    operator_delete(pTVar2);
    lVar3 = -4;
    pTVar2 = local_88.first_;
    while (pTVar2 != (TestObject *)0x0) {
      pTVar2 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      lVar3 = lVar3 + 1;
      if (lVar3 == 0) {
        uStack_b0 = 0;
        iVar4 = (int)&local_f8;
        local_b8 = &local_f8;
        wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
                  (&local_88,(int)&local_88,(__off64_t *)pTVar2,iVar4,(__off64_t *)&local_f8,
                   (size_t)local_f8.first_,iVar4);
        local_68.size_ = 0;
        local_68.first_ = (TestObject *)0x0;
        local_68.last_ = (TestObject *)0x0;
        pTVar2 = (TestObject *)operator_new(0x20);
        local_68.last_ = pTVar2 + 1;
        (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
             (TestObject *)0xc800000064;
        (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
             (TestObject *)&DAT_200000001;
        pTVar2->data = 400;
        pTVar2->data2 = 3;
        *(undefined8 *)&pTVar2->moved = 0x2bc00000258;
        local_68.first_ = pTVar2;
        local_68.size_ = (size_t)local_68.last_;
        anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq
                  ((IntrusiveListTest *)&local_88,&local_68,expected_03);
        operator_delete(pTVar2);
        local_68.size_ = 0;
        local_68.first_ = (TestObject *)0x0;
        local_68.last_ = (TestObject *)0x0;
        anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq
                  ((IntrusiveListTest *)&local_f8,&local_68,expected_04);
        pTVar2 = local_f8.first_;
        while (pTVar1 = local_d8.first_, pTVar2 != (TestObject *)0x0) {
          if (pTVar2->moved == false) {
            (anonymous_namespace)::TestObject::creation_count =
                 (anonymous_namespace)::TestObject::creation_count + -1;
          }
          pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
          operator_delete(pTVar2);
          pTVar2 = pTVar1;
        }
        while (pTVar2 = local_48.first_, pTVar1 != (TestObject *)0x0) {
          if (pTVar1->moved == false) {
            (anonymous_namespace)::TestObject::creation_count =
                 (anonymous_namespace)::TestObject::creation_count + -1;
          }
          pTVar2 = (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
          operator_delete(pTVar1);
          pTVar1 = pTVar2;
        }
        while (pTVar2 != (TestObject *)0x0) {
          if (pTVar2->moved == false) {
            (anonymous_namespace)::TestObject::creation_count =
                 (anonymous_namespace)::TestObject::creation_count + -1;
          }
          pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
          operator_delete(pTVar2);
          pTVar2 = pTVar1;
        }
        while (local_88.first_ != (TestObject *)0x0) {
          if ((local_88.first_)->moved == false) {
            (anonymous_namespace)::TestObject::creation_count =
                 (anonymous_namespace)::TestObject::creation_count + -1;
          }
          pTVar2 = ((local_88.first_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>)
                   .next_;
          operator_delete(local_88.first_);
          local_88.first_ = pTVar2;
        }
        return;
      }
    }
  }
  __assert_fail("node_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0xa5,
                "iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator++() [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

TEST_F(IntrusiveListTest, splice_range) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200, 300});
  list1.splice(list1.begin(), list2, list2.begin(), std::prev(list2.end()));
  AssertListEq(list1, {100, 200, 1, 2, 3});
  AssertListEq(list2, {300});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3, std::next(list3.begin()), list3.end());
  AssertListEq(list1, {100, 200, 1, 2, 3, 600, 700});
  AssertListEq(list3, {500});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 4), list4, list4.begin(), list4.end());
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 600, 700});
  AssertListEq(list4, {});
}